

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::_q_enterInteractiveMode(QMdiSubWindowPrivate *this)

{
  long lVar1;
  Representation RVar2;
  bool bVar3;
  QWidget *this_00;
  QAction *pQVar4;
  QStyle *pQVar5;
  QPoint QVar6;
  QRect *pQVar7;
  Operation OVar8;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int x;
  int offset;
  QMdiSubWindow *q;
  QPoint pressPos;
  QAction *action;
  int in_stack_ffffffffffffff88;
  SubWindowOption in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QCursor local_30;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  QObject::sender();
  pQVar4 = qobject_cast<QAction*>((QObject *)0x62d091);
  if (pQVar4 != (QAction *)0x0) {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x62d0ce);
    if ((bVar3) &&
       (bVar3 = ::operator==((QPointer<QAction> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (QAction **)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)), bVar3))
    {
      in_RDI->currentOperation = Move;
      in_stack_ffffffffffffff9c = QWidget::width((QWidget *)0x62d10d);
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c / 2;
      titleBarHeight((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
    else {
      bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x62d15a);
      if ((!bVar3) ||
         (bVar3 = ::operator==((QPointer<QAction> *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               (QAction **)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
         !bVar3)) goto LAB_0062d355;
      bVar3 = QWidget::isLeftToRight((QWidget *)0x62d190);
      OVar8 = BottomLeftResize;
      if (bVar3) {
        OVar8 = BottomRightResize;
      }
      in_RDI->currentOperation = OVar8;
      pQVar5 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff94 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x2c,0,this_00);
      in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 / 2;
      bVar3 = QWidget::isLeftToRight((QWidget *)0x62d1e7);
      in_stack_ffffffffffffffac = in_stack_ffffffffffffff94;
      if (bVar3) {
        in_stack_ffffffffffffff94 = QWidget::width((QWidget *)0x62d1f7);
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 - in_stack_ffffffffffffffac;
      }
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff94;
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff94;
      QWidget::height((QWidget *)0x62d223);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
    updateCursor(in_RDI);
    QWidget::cursor((QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QWidget::mapToGlobal
              ((QWidget *)in_RDI,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QCursor::setPos((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    QCursor::~QCursor(&local_30);
    QVar6 = QWidget::mapToParent
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_RDI->mousePressPosition = QVar6;
    pQVar7 = QWidget::geometry(this_00);
    RVar2.m_i = (pQVar7->y1).m_i;
    (in_RDI->oldGeometry).x1 = (Representation)(pQVar7->x1).m_i;
    (in_RDI->oldGeometry).y1 = (Representation)RVar2.m_i;
    RVar2.m_i = (pQVar7->y2).m_i;
    (in_RDI->oldGeometry).x2 = (Representation)(pQVar7->x2).m_i;
    (in_RDI->oldGeometry).y2 = (Representation)RVar2.m_i;
    in_RDI->isInInteractiveMode = true;
    QWidget::setFocus((QWidget *)0x62d2eb);
    bVar3 = QMdiSubWindow::testOption
                      ((QMdiSubWindow *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c);
    if (((bVar3) &&
        ((in_RDI->currentOperation == BottomRightResize ||
         (in_RDI->currentOperation == BottomLeftResize)))) ||
       ((bVar3 = QMdiSubWindow::testOption
                           ((QMdiSubWindow *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff8c), bVar3 && (in_RDI->currentOperation == Move))
       )) {
      enterRubberBandMode(in_stack_ffffffffffffffd8);
    }
    else {
      QWidget::grabMouse((QWidget *)0x62d355);
    }
  }
LAB_0062d355:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::_q_enterInteractiveMode()
{
#ifndef QT_NO_ACTION
    Q_Q(QMdiSubWindow);
    QAction *action = qobject_cast<QAction *>(q->sender());
    if (!action)
        return;

    QPoint pressPos;
    if (actions[MoveAction] && actions[MoveAction] == action) {
        currentOperation = Move;
        pressPos = QPoint(q->width() / 2, titleBarHeight() - 1);
    } else if (actions[ResizeAction] && actions[ResizeAction] == action) {
        currentOperation = q->isLeftToRight() ? BottomRightResize : BottomLeftResize;
        int offset = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q) / 2;
        int x = q->isLeftToRight() ? q->width() - offset : offset;
        pressPos = QPoint(x, q->height() - offset);
    } else {
        return;
    }

    updateCursor();
#ifndef QT_NO_CURSOR
    q->cursor().setPos(q->mapToGlobal(pressPos));
#endif
    mousePressPosition = q->mapToParent(pressPos);
    oldGeometry = q->geometry();
    isInInteractiveMode = true;
    q->setFocus();
#if QT_CONFIG(rubberband)
    if ((q->testOption(QMdiSubWindow::RubberBandResize)
            && (currentOperation == BottomRightResize || currentOperation == BottomLeftResize))
            || (q->testOption(QMdiSubWindow::RubberBandMove) && currentOperation == Move)) {
        enterRubberBandMode();
    } else
#endif // QT_CONFIG(rubberband)
    {
        q->grabMouse();
    }
#endif // QT_NO_ACTION
}